

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int ReadHuffmanCode(int alphabet_size,VP8LDecoder *dec,int *code_lengths,HuffmanTables *table)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  int *in_RCX;
  void *in_RDX;
  VP8LDecoder *in_RSI;
  int in_EDI;
  bool bVar4;
  int num_codes;
  int code_length_code_lengths [19];
  int i;
  int symbol;
  int first_symbol_len_code;
  int num_symbols;
  int simple_code;
  VP8LBitReader *br;
  int size;
  int ok;
  int in_stack_00000374;
  int *in_stack_00000378;
  int in_stack_00000384;
  HuffmanTables *in_stack_00000388;
  int in_stack_ffffffffffffff64;
  VP8LBitReader *in_stack_ffffffffffffff68;
  int local_44;
  int local_24;
  VP8LDecoder *dec_00;
  undefined4 in_stack_fffffffffffffffc;
  
  dec_00 = in_RSI;
  uVar1 = VP8LReadBits(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  memset(in_RDX,0,(long)in_EDI << 2);
  if (uVar1 == 0) {
    memset(&stack0xffffffffffffff68,0,0x4c);
    uVar1 = VP8LReadBits(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    iVar3 = uVar1 + 4;
    for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
      uVar1 = VP8LReadBits(in_stack_ffffffffffffff68,iVar3);
      *(uint32_t *)(&stack0xffffffffffffff68 + (ulong)"\x11\x12"[local_44] * 4) = uVar1;
    }
    local_24 = ReadHuffmanCodeLengths
                         ((VP8LDecoder *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),(int *)dec_00,
                          (int)((ulong)in_RDX >> 0x20),in_RCX);
  }
  else {
    uVar1 = VP8LReadBits(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    VP8LReadBits(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    uVar2 = VP8LReadBits(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    *(undefined4 *)((long)in_RDX + (long)(int)uVar2 * 4) = 1;
    if (uVar1 == 1) {
      uVar1 = VP8LReadBits(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      *(undefined4 *)((long)in_RDX + (long)(int)uVar1 * 4) = 1;
    }
    local_24 = 1;
  }
  bVar4 = false;
  if (local_24 != 0) {
    bVar4 = (in_RSI->br_).eos_ == 0;
  }
  if ((!bVar4) ||
     (iVar3 = VP8LBuildHuffmanTable
                        (in_stack_00000388,in_stack_00000384,in_stack_00000378,in_stack_00000374),
     iVar3 == 0)) {
    iVar3 = VP8LSetError(dec_00,VP8_STATUS_BITSTREAM_ERROR);
  }
  return iVar3;
}

Assistant:

static int ReadHuffmanCode(int alphabet_size, VP8LDecoder* const dec,
                           int* const code_lengths,
                           HuffmanTables* const table) {
  int ok = 0;
  int size = 0;
  VP8LBitReader* const br = &dec->br_;
  const int simple_code = VP8LReadBits(br, 1);

  memset(code_lengths, 0, alphabet_size * sizeof(*code_lengths));

  if (simple_code) {  // Read symbols, codes & code lengths directly.
    const int num_symbols = VP8LReadBits(br, 1) + 1;
    const int first_symbol_len_code = VP8LReadBits(br, 1);
    // The first code is either 1 bit or 8 bit code.
    int symbol = VP8LReadBits(br, (first_symbol_len_code == 0) ? 1 : 8);
    code_lengths[symbol] = 1;
    // The second code (if present), is always 8 bits long.
    if (num_symbols == 2) {
      symbol = VP8LReadBits(br, 8);
      code_lengths[symbol] = 1;
    }
    ok = 1;
  } else {  // Decode Huffman-coded code lengths.
    int i;
    int code_length_code_lengths[NUM_CODE_LENGTH_CODES] = { 0 };
    const int num_codes = VP8LReadBits(br, 4) + 4;
    assert(num_codes <= NUM_CODE_LENGTH_CODES);

    for (i = 0; i < num_codes; ++i) {
      code_length_code_lengths[kCodeLengthCodeOrder[i]] = VP8LReadBits(br, 3);
    }
    ok = ReadHuffmanCodeLengths(dec, code_length_code_lengths, alphabet_size,
                                code_lengths);
  }

  ok = ok && !br->eos_;
  if (ok) {
    size = VP8LBuildHuffmanTable(table, HUFFMAN_TABLE_BITS,
                                 code_lengths, alphabet_size);
  }
  if (!ok || size == 0) {
    return VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
  }
  return size;
}